

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O3

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  uint __fd;
  uv_loop_t *puVar2;
  char *unaff_RBX;
  uv_pipe_t *loop;
  size_t len;
  char buf [1024];
  size_t sStack_8a8;
  undefined1 auStack_89e [20];
  undefined8 uStack_88a;
  undefined8 uStack_882;
  undefined8 uStack_87a;
  undefined8 uStack_872;
  undefined8 uStack_86a;
  undefined8 uStack_862;
  undefined8 uStack_85a;
  undefined8 uStack_852;
  undefined8 uStack_84a;
  undefined8 uStack_842;
  undefined8 uStack_83a;
  undefined2 uStack_832;
  undefined3 uStack_830;
  undefined5 uStack_82d;
  undefined3 uStack_828;
  char *pcStack_428;
  undefined8 local_410;
  char local_408 [1024];
  
  if (req == &connect_req) {
    if (status != 0) goto LAB_00163184;
    local_410 = 0x400;
    unaff_RBX = local_408;
    iVar1 = uv_pipe_getpeername(&pipe_client,unaff_RBX,&local_410);
    if (iVar1 != 0) goto LAB_00163189;
    if (unaff_RBX[local_410 - 1] == '\0') goto LAB_0016318e;
    iVar1 = bcmp(local_408,"/tmp/uv-test-sock",local_410);
    if (iVar1 != 0) goto LAB_00163193;
    local_410 = 0x400;
    iVar1 = uv_pipe_getsockname(&pipe_client,local_408,&local_410);
    if ((iVar1 == 0) && (local_410 == 0)) {
      pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
      uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
      uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
      return;
    }
  }
  else {
    pipe_client_connect_cb_cold_1();
LAB_00163184:
    pipe_client_connect_cb_cold_2();
LAB_00163189:
    pipe_client_connect_cb_cold_3();
LAB_0016318e:
    pipe_client_connect_cb_cold_6();
LAB_00163193:
    pipe_client_connect_cb_cold_4();
  }
  pipe_client_connect_cb_cold_5();
  loop = (uv_pipe_t *)0x1;
  pcStack_428 = unaff_RBX;
  __fd = socket(1,1,0);
  if (__fd == 0xffffffff) {
    run_test_pipe_getsockname_abstract_cold_8();
LAB_0016330e:
    run_test_pipe_getsockname_abstract_cold_1();
LAB_00163313:
    run_test_pipe_getsockname_abstract_cold_2();
LAB_00163318:
    run_test_pipe_getsockname_abstract_cold_3();
LAB_0016331d:
    run_test_pipe_getsockname_abstract_cold_4();
LAB_00163322:
    run_test_pipe_getsockname_abstract_cold_5();
  }
  else {
    auStack_89e._13_7_ = 0;
    uStack_88a = 0;
    uStack_842 = 0;
    uStack_83a = 0;
    uStack_852 = 0;
    uStack_84a = 0;
    uStack_862 = 0;
    uStack_85a = 0;
    uStack_872 = 0;
    uStack_86a = 0;
    uStack_882 = 0;
    uStack_87a = 0;
    uStack_832 = 0;
    auStack_89e._0_2_ = 1;
    auStack_89e[2] = '\0';
    auStack_89e[3] = 't';
    auStack_89e[4] = 'e';
    auStack_89e[5] = 's';
    auStack_89e[6] = 't';
    auStack_89e[7] = '-';
    auStack_89e[8] = 'p';
    auStack_89e[9] = 'i';
    auStack_89e[10] = 'p';
    auStack_89e[0xb] = 'e';
    auStack_89e[0xc] = '\0';
    loop = (uv_pipe_t *)(ulong)__fd;
    iVar1 = bind(__fd,(sockaddr *)auStack_89e,0x6e);
    if (iVar1 != 0) goto LAB_0016330e;
    loop = (uv_pipe_t *)uv_default_loop();
    iVar1 = uv_pipe_init((uv_loop_t *)loop,&pipe_server,0);
    if (iVar1 != 0) goto LAB_00163313;
    loop = &pipe_server;
    iVar1 = uv_pipe_open(&pipe_server,__fd);
    if (iVar1 != 0) goto LAB_00163318;
    sStack_8a8 = 0x400;
    loop = &pipe_server;
    iVar1 = uv_pipe_getsockname(&pipe_server,(char *)&uStack_830,&sStack_8a8);
    if (iVar1 != 0) goto LAB_0016331d;
    if (CONCAT35(uStack_828,uStack_82d) != 0x657069702d7473 ||
        CONCAT53(uStack_82d,uStack_830) != 0x69702d7473657400) goto LAB_00163322;
    uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    loop = (uv_pipe_t *)(ulong)__fd;
    close(__fd);
    if (pipe_close_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      loop = (uv_pipe_t *)uv_default_loop();
      iVar1 = uv_loop_close((uv_loop_t *)loop);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0016332c;
    }
  }
  run_test_pipe_getsockname_abstract_cold_6();
LAB_0016332c:
  run_test_pipe_getsockname_abstract_cold_7();
  if (loop == &pipe_server || loop == &pipe_client) {
    pipe_close_cb_called = pipe_close_cb_called + 1;
    return;
  }
  pipe_close_cb_cold_1();
  puVar2 = uv_default_loop();
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  uv_run(puVar2,UV_RUN_DEFAULT);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 == 0) {
    return;
  }
  run_test_pipe_getsockname_blocking_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return;
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT(req == &connect_req);
  ASSERT(status == 0);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT(r == 0);

  ASSERT(buf[len - 1] != 0);
  ASSERT(memcmp(buf, TEST_PIPENAME, len) == 0);

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;


  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}